

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

ctmbstr prvTidygetNextMutedMessage(TidyDocImpl *doc,TidyIterator *iter)

{
  TidyIterator local_38;
  ctmbstr local_30;
  ctmbstr result;
  size_t index;
  TidyMutedMessages *list;
  TidyIterator *iter_local;
  TidyDocImpl *doc_local;
  
  local_30 = (ctmbstr)0x0;
  if (iter != (TidyIterator *)0x0) {
    result = (ctmbstr)*iter;
    if (((TidyIterator)result != (TidyIterator)0x0) &&
       (result <= (TidyIterator)(ulong)(doc->muted).count)) {
      local_30 = prvTidytidyErrorCodeAsKey
                           ((doc->muted).list
                            [(long)((long)&((TidyIterator)((long)result + -4))->_opaque + 3)]);
      result = (ctmbstr)((long)&((TidyIterator)result)->_opaque + 1);
    }
    if ((ctmbstr)(ulong)(doc->muted).count < result) {
      local_38 = (TidyIterator)0x0;
    }
    else {
      local_38 = (TidyIterator)result;
    }
    *iter = local_38;
    return local_30;
  }
  __assert_fail("iter != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/message.c"
                ,0x563,"ctmbstr prvTidygetNextMutedMessage(TidyDocImpl *, TidyIterator *)");
}

Assistant:

ctmbstr TY_(getNextMutedMessage)( TidyDocImpl* doc, TidyIterator* iter )
{
    TidyMutedMessages *list = &(doc->muted);
    size_t index;
    ctmbstr result = NULL;
    assert( iter != NULL );
    index = (size_t)*iter;

    if ( index > 0 && index <= list->count )
    {
        result = TY_(tidyErrorCodeAsKey)(list->list[index-1]);
        index++;
    }
    *iter = (TidyIterator) ( index <= list->count ? index : (size_t)0 );

    return result;
}